

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O1

void __thiscall
mjs::not_callable_exception::not_callable_exception(not_callable_exception *this,value *v)

{
  value *in_RDX;
  string local_30;
  
  format_error_message_abi_cxx11_(&local_30,(not_callable_exception *)v,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00250a58;
  return;
}

Assistant:

explicit not_callable_exception(const value& v) : std::runtime_error(format_error_message(v)) {
    }